

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smps2asm2bin.c
# Opt level: O0

void ParseLine(char *line)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  DelayedInstruction *pDVar6;
  uint uVar7;
  DelayedInstruction *delayed_instruction;
  size_t output_position;
  _Bool is_last_arg;
  size_t size_of_whitespace_2;
  size_t size_of_arg;
  char **arg_array;
  uint arg_count;
  char *instruction;
  size_t size_of_whitespace_1;
  size_t size_of_instruction;
  size_t size_of_whitespace;
  size_t size_of_label;
  char *comment_start;
  char *line_local;
  
  pcVar1 = strchr(line,0x3b);
  if (pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
  }
  sVar2 = strcspn(line," \t:");
  sVar3 = strspn(line + sVar2," \t:");
  if (sVar2 != 0) {
    line[sVar2] = '\0';
    HandleLabel(line);
  }
  pcVar1 = line + sVar2 + sVar3;
  sVar2 = strcspn(pcVar1," \t");
  if (sVar2 != 0) {
    sVar3 = strspn(pcVar1 + sVar2," \t");
    pcVar1[sVar2] = '\0';
    comment_start = pcVar1 + sVar2 + sVar3;
    arg_array._4_4_ = 0;
    size_of_arg = 0;
    while( true ) {
      sVar2 = strcspn(comment_start," \t,");
      sVar3 = strspn(comment_start + sVar2," \t,");
      pcVar4 = strchr(comment_start,0x2c);
      if (sVar2 == 0) break;
      comment_start[sVar2] = '\0';
      size_of_arg = (size_t)realloc((void *)size_of_arg,(ulong)(arg_array._4_4_ + 1) << 3);
      uVar7 = arg_array._4_4_ + 1;
      *(char **)(size_of_arg + (ulong)arg_array._4_4_ * 8) = comment_start;
      arg_array._4_4_ = uVar7;
      if (pcVar4 == (char *)0x0) break;
      comment_start = comment_start + sVar2 + sVar3;
    }
    sVar5 = MemoryStream_GetPosition(output_stream);
    undefined_symbol = (char *)0x0;
    HandleInstruction(pcVar1,arg_array._4_4_,(char **)size_of_arg);
    if (undefined_symbol == (char *)0x0) {
      free((void *)size_of_arg);
    }
    else {
      pDVar6 = (DelayedInstruction *)malloc(0x28);
      pDVar6->next = delayed_instruction_list_head;
      delayed_instruction_list_head = pDVar6;
      pDVar6->instruction = pcVar1;
      pDVar6->arg_count = arg_array._4_4_;
      pDVar6->arg_array = (char **)size_of_arg;
      pDVar6->output_position = sVar5;
    }
  }
  return;
}

Assistant:

static void ParseLine(char *line)
{
	// Remove comments
	char *comment_start = strchr(line, ';');
	if (comment_start)
		*comment_start = '\0';

	// Look for a label
	const size_t size_of_label = strcspn(line, " \t:");
	size_t size_of_whitespace = strspn(line + size_of_label, " \t:");

	if (size_of_label != 0)
	{
		// We found a label!
		line[size_of_label] = '\0';
		HandleLabel(line);
	}

	line += size_of_label + size_of_whitespace;

	// Look for an instruction
	const size_t size_of_instruction = strcspn(line, " \t");

	if (size_of_instruction != 0)
	{
		size_t size_of_whitespace = strspn(line + size_of_instruction, " \t");

		// We found an instruction!
		line[size_of_instruction] = '\0';
		char *instruction = line;

		// Look for the instruction's arguments
		line += size_of_instruction + size_of_whitespace;

		unsigned int arg_count = 0;
		char **arg_array = NULL;

		for (;;)
		{
			const size_t size_of_arg = strcspn(line, " \t,");
			const size_t size_of_whitespace = strspn(line + size_of_arg, " \t,");
			const bool is_last_arg = strchr(line, ',') == NULL;

			if (size_of_arg != 0)
			{
				// We found an argument!
				line[size_of_arg] = '\0';
				arg_array = realloc(arg_array, sizeof(*arg_array) * (arg_count + 1));
				arg_array[arg_count++] = line;

				if (is_last_arg)
					break;

				line += size_of_arg + size_of_whitespace;
			}
			else
				break;

		}

		const size_t output_position = MemoryStream_GetPosition(output_stream);

		// Now that we've gathered-up the instruction and arguments in a nice format
		// that we can process, pass them to the function that actually parses them
		undefined_symbol = NULL;
		HandleInstruction(instruction, arg_count, arg_array);

		if (undefined_symbol != NULL)
		{
			// Instructions that reference undefined symbols can't be
			// fully-outputted yet, so stick them in a list for later
			DelayedInstruction *delayed_instruction = malloc(sizeof(*delayed_instruction));
			delayed_instruction->next = delayed_instruction_list_head;
			delayed_instruction_list_head = delayed_instruction;

			delayed_instruction->instruction = instruction;
			delayed_instruction->arg_count = arg_count;
			delayed_instruction->arg_array = arg_array;
			delayed_instruction->output_position = output_position;
		}
		else
		{
			free(arg_array);
		}
	}
}